

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

Matrix<double,_2,_2> * __thiscall
gl4cts::Math::transpose<double,2,2>
          (Matrix<double,_2,_2> *__return_storage_ptr__,Math *this,Matrix<double,_2,_2> *matrix)

{
  tcu::transpose<double,2,2>(__return_storage_ptr__,(tcu *)this,matrix);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<T, Cols, Rows> transpose(const tcu::Matrix<T, Rows, Cols>& matrix)
{
	tcu::Matrix<T, Cols, Rows> result = tcu::transpose(matrix);

	return result;
}